

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  SVG *pSVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  char *ctx;
  Renderer *renderer;
  Viewer local_1a2;
  allocator<char> local_1a1;
  undefined1 local_1a0 [6];
  Viewer viewer;
  allocator<char> local_179;
  string local_178;
  vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> local_158;
  undefined1 local_140 [8];
  DrawRend app;
  undefined1 local_30 [8];
  vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> svgs;
  char **argv_local;
  int argc_local;
  
  svgs.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)argv;
  if (argc < 2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"[Drawer] ");
    poVar5 = std::operator<<(poVar5,
                             "Not enough arguments. Pass in an .svg or a directory of .svg files.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    loadPath((vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *)local_30,argv[1]);
    bVar2 = std::vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>::empty
                      ((vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *)local_30);
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"[Drawer] ");
      poVar5 = std::operator<<(poVar5,"No svg files successfully loaded. Exiting.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      app.samplebuffer.
      super__Vector_base<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    else {
      std::vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>::vector
                (&local_158,(vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *)local_30);
      CGL::DrawRend::DrawRend((DrawRend *)local_140,&local_158);
      std::vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>::~vector(&local_158);
      if (argc < 5) {
LAB_0019dfbb:
        CGL::Viewer::Viewer(&local_1a2);
        renderer = (Renderer *)local_140;
        CGL::Viewer::set_renderer(&local_1a2,renderer);
        CGL::Viewer::init(&local_1a2,(EVP_PKEY_CTX *)renderer);
        CGL::Viewer::start(&local_1a2);
        exit(0);
      }
      ctx = "nogl";
      iVar3 = strcmp((char *)svgs.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage[2],"nogl");
      if (iVar3 != 0) goto LAB_0019dfbb;
      CGL::DrawRend::init((DrawRend *)local_140,(EVP_PKEY_CTX *)ctx);
      CGL::DrawRend::set_gl((DrawRend *)local_140,false);
      pSVar1 = svgs.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[3];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,(char *)pSVar1,&local_179);
      iVar3 = std::__cxx11::stoi(&local_178,(size_t *)0x0,10);
      pSVar1 = svgs.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[4];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a0,(char *)pSVar1,&local_1a1);
      iVar4 = std::__cxx11::stoi((string *)local_1a0,(size_t *)0x0,10);
      CGL::DrawRend::resize((DrawRend *)local_140,(long)iVar3,(long)iVar4);
      std::__cxx11::string::~string((string *)local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator(&local_179);
      CGL::DrawRend::write_framebuffer((DrawRend *)local_140);
      app.samplebuffer.
      super__Vector_base<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      CGL::DrawRend::~DrawRend((DrawRend *)local_140);
    }
    std::vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>::~vector
              ((vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *)local_30);
  }
  return 0;
}

Assistant:

int main( int argc, char** argv ) {

  if (argc < 2) {
    msg("Not enough arguments. Pass in an .svg or a directory of .svg files.");
    return 0;
  }

  vector<SVG*> svgs(loadPath(argv[1]));
  if (svgs.empty()) {
    msg("No svg files successfully loaded. Exiting.");
    return 0;
  }

  // create application
  DrawRend app(svgs);

  if (argc > 4 && strcmp(argv[2],"nogl") == 0) {
    app.init();
    app.set_gl(false);
    app.resize(stoi(argv[3]), stoi(argv[4]));
    app.write_framebuffer();
    return 0;
  }

  // create viewer
  Viewer viewer = Viewer();

  // set renderer
  viewer.set_renderer(&app);

  // init viewer
  viewer.init();

  // start viewer
  viewer.start();

  exit(EXIT_SUCCESS);

  return 0;

}